

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

REF_STATUS ref_swap_tri_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  REF_CELL ref_cell;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_INT new_cell;
  REF_INT node3;
  REF_INT node2;
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_INT nodes [27];
  REF_INT local_b0;
  REF_INT local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  int local_9c;
  REF_INT local_98;
  REF_INT local_94;
  REF_INT local_90;
  
  ref_cell = ref_grid->cell[3];
  uVar1 = ref_swap_node23(ref_grid,node0,node1,&local_a8,&local_ac);
  if (uVar1 == 0) {
    uVar1 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_9c,&local_a4);
    if (uVar1 == 0) {
      if ((long)local_9c != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x2b4,"ref_swap_tri_edge","there should be two triangles for manifold",2,
               (long)local_9c);
        return 1;
      }
      uVar1 = ref_cell_nodes(ref_cell,local_a4,&local_98);
      if (uVar1 == 0) {
        uVar1 = ref_cell_remove(ref_cell,local_a4);
        if (uVar1 == 0) {
          uVar1 = ref_cell_remove(ref_cell,local_a0);
          if (uVar1 == 0) {
            local_94 = local_ac;
            local_90 = local_a8;
            local_98 = node0;
            uVar1 = ref_cell_add(ref_cell,&local_98,&local_b0);
            if (uVar1 == 0) {
              local_94 = local_a8;
              local_90 = local_ac;
              local_98 = node1;
              uVar1 = ref_cell_add(ref_cell,&local_98,&local_b0);
              if (uVar1 == 0) {
                return 0;
              }
              pcVar3 = "add node0 version";
              uVar2 = 0x2c0;
            }
            else {
              pcVar3 = "add node0 version";
              uVar2 = 700;
            }
          }
          else {
            pcVar3 = "remove";
            uVar2 = 0x2b7;
          }
        }
        else {
          pcVar3 = "remove";
          uVar2 = 0x2b6;
        }
      }
      else {
        pcVar3 = "nodes tri0";
        uVar2 = 0x2b5;
      }
    }
    else {
      pcVar3 = "more then two";
      uVar2 = 0x2b3;
    }
  }
  else {
    pcVar3 = "other nodes";
    uVar2 = 0x2b0;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar2,
         "ref_swap_tri_edge",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_swap_tri_edge(REF_GRID ref_grid, REF_INT node0,
                                            REF_INT node1) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_INT new_cell;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_cell_remove(ref_cell, cell_to_swap[0]), "remove");
  RSS(ref_cell_remove(ref_cell, cell_to_swap[1]), "remove");

  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");

  return REF_SUCCESS;
}